

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QAbstractAnimation_*>::clear(QList<QAbstractAnimation_*> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QPodArrayOps<QAbstractAnimation_*> *this_00;
  __off_t __length;
  QArrayDataPointer<QAbstractAnimation_*> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QAbstractAnimation_*> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<QAbstractAnimation_*> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QAbstractAnimation_*> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QAbstractAnimation_*>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QAbstractAnimation_*>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<QAbstractAnimation_*> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<QAbstractAnimation_*>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QAbstractAnimation_*>::QArrayDataPointer
                (pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<QAbstractAnimation_*>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QAbstractAnimation_*>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QPodArrayOps<QAbstractAnimation_*> *)
                QArrayDataPointer<QAbstractAnimation_*>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<QAbstractAnimation_*>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }